

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O3

void __thiscall nn::ESoinn::deleteNeuron(ESoinn *this,uint32_t number)

{
  AbstractWeightVector *pAVar1;
  long lVar2;
  ConcreteLogger *this_00;
  pointer pEVar3;
  ulong uVar4;
  pointer pEVar5;
  ulong uVar6;
  bool bVar7;
  string local_50;
  
  this_00 = log_netw;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"deleteNeuron function","");
  logger::ConcreteLogger::debug(this_00,&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pEVar5 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = pEVar5[number].super_AbstractNeuron.m_wv;
  if (pAVar1 != (AbstractWeightVector *)0x0) {
    (*pAVar1->_vptr_AbstractWeightVector[7])(pAVar1);
    pEVar5 = (this->m_Neurons).
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
  pEVar5[number].m_IsDeleted = true;
  pEVar3 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar5) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      if (pEVar5[uVar4].m_IsDeleted == false) {
        local_50._M_dataplus._M_p._0_4_ = number;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&pEVar5[uVar4].m_Neighbours._M_h,&local_50);
        pEVar5 = (this->m_Neurons).
                 super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar3 = (this->m_Neurons).
                 super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = ((long)pEVar3 - (long)pEVar5 >> 3) * -0xf0f0f0f0f0f0f0f;
      bVar7 = uVar6 <= uVar4;
      lVar2 = uVar4 - uVar6;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar2 != 0);
  }
  return;
}

Assistant:

void ESoinn::deleteNeuron(uint32_t number)
    { 
        log_netw->debug("deleteNeuron function");
        //delete neuron with number
        delete m_Neurons[number].getWv();   
        m_Neurons[number].setDeleted();
        
        //delete all connections between other neurons and deleted neuron
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            m_Neurons[i].deleteConcreteNeighbour(number);    
        }    
    }